

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O1

void ts_stack_iterate(Stack *self,StackVersion version,StackIterateCallback callback,void *payload)

{
  uint32_t *puVar1;
  undefined8 *puVar2;
  StackHead *self_00;
  uint32_t uVar3;
  undefined4 uVar4;
  StackIterator *pSVar5;
  StackSlice *pSVar6;
  StackNode *pSVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  long lVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  SubtreeArray self_01;
  undefined8 uVar14;
  undefined4 uVar15;
  uint32_t uVar16;
  byte bVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  StackIterator *pSVar21;
  Subtree *pSVar22;
  StackNode *pSVar23;
  uint extraout_EDX;
  uint extraout_EDX_00;
  SubtreeArray *pSVar24;
  ulong uVar25;
  Stack *pSVar26;
  _Bool *p_Var27;
  Subtree SVar28;
  Stack *self_02;
  uint uVar29;
  SubtreeHeapData *pSVar30;
  Stack *pSVar31;
  ulong uVar32;
  uint uVar33;
  StackNode *pSVar34;
  ulong uVar35;
  long *plVar36;
  bool bVar37;
  StackIterator current_iterator;
  byte bStack_1b9;
  SubtreeArray SStack_188;
  undefined8 uStack_178;
  undefined8 uStack_170;
  ulong uStack_160;
  Stack *pSStack_158;
  StackNode *pSStack_150;
  ulong uStack_148;
  Subtree *pSStack_140;
  Stack *pSStack_138;
  byte bStack_121;
  Stack *pSStack_120;
  uint uStack_118;
  uint uStack_114;
  StackNode *pSStack_110;
  long lStack_108;
  uint uStack_fc;
  ulong uStack_f8;
  SubtreeArray SStack_f0;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  StackNode *pSStack_c8;
  Stack *pSStack_c0;
  
  (self->slices).size = 0;
  (self->iterators).size = 0;
  if ((self->heads).size <= version) {
LAB_0012f516:
    __assert_fail("(uint32_t)version < (&self->heads)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                  ,0x118,
                  "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)");
  }
  pSVar23 = (self->heads).contents[version].node;
  uVar18 = (self->iterators).capacity;
  if ((self->iterators).size != uVar18) goto LAB_0012f225;
  pSVar26 = (Stack *)0x8;
  if (8 < uVar18 * 2) {
    pSVar26 = (Stack *)(ulong)(uVar18 * 2);
  }
  uVar20 = (uint)pSVar26;
  if (uVar20 <= uVar18) goto LAB_0012f225;
  pSVar21 = (self->iterators).contents;
  if (pSVar21 == (StackIterator *)0x0) {
LAB_0012f202:
    uVar18 = 0x20;
    pSVar21 = (StackIterator *)calloc((size_t)pSVar26,0x20);
    if (pSVar21 == (StackIterator *)0x0) {
      pSVar31 = pSVar26;
      ts_stack_iterate_cold_4();
      uVar35 = 0;
      (pSVar31->slices).size = 0;
      (pSVar31->iterators).size = 0;
      pSStack_c8 = pSVar23;
      pSStack_c0 = pSVar26;
      if ((pSVar31->heads).size <= uVar18) {
LAB_0012fa16:
        pSStack_138 = (Stack *)0x12fa35;
        __assert_fail("(uint32_t)version < (&self->heads)->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                      ,0x118,
                      "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                     );
      }
      pSVar23 = (pSVar31->heads).contents[uVar18].node;
      pSStack_120 = pSVar31;
      uStack_fc = uVar18;
      if ((int)extraout_EDX < 1) {
LAB_0012f59c:
        pSVar22 = (Subtree *)0x0;
      }
      else {
        pSStack_138 = (Stack *)0x12f589;
        pSVar22 = (Subtree *)calloc((ulong)extraout_EDX,8);
        uVar35 = (ulong)extraout_EDX;
        if (pSVar22 == (Subtree *)0x0) {
          pSStack_138 = (Stack *)0x12f59c;
          ts_stack_pop_count_cold_7();
          goto LAB_0012f59c;
        }
      }
      uVar18 = (pSStack_120->iterators).capacity;
      if ((pSStack_120->iterators).size != uVar18) goto LAB_0012f60b;
      pSVar26 = (Stack *)0x8;
      if (8 < uVar18 * 2) {
        pSVar26 = (Stack *)(ulong)(uVar18 * 2);
      }
      if ((uint)pSVar26 <= uVar18) goto LAB_0012f60b;
      uVar32 = (ulong)extraout_EDX;
      pSVar21 = (pSStack_120->iterators).contents;
      pSVar31 = pSVar26;
      if (pSVar21 == (StackIterator *)0x0) {
LAB_0012f5e6:
        uVar25 = 0x20;
        pSStack_138 = (Stack *)0x12f5f3;
        pSVar21 = (StackIterator *)calloc((size_t)pSVar31,0x20);
        if (pSVar21 == (StackIterator *)0x0) {
          pSStack_138 = (Stack *)ts_stack_pop_pending;
          self_02 = pSVar31;
          ts_stack_pop_count_cold_6();
          (self_02->slices).size = 0;
          (self_02->iterators).size = 0;
          uVar18 = (uint)uVar25;
          uStack_160 = uVar35;
          pSStack_158 = pSVar31;
          pSStack_150 = pSVar23;
          uStack_148 = uVar32;
          pSStack_140 = pSVar22;
          pSStack_138 = pSVar26;
          if ((self_02->heads).size <= uVar18) {
LAB_0012ff12:
            __assert_fail("(uint32_t)version < (&self->heads)->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                          ,0x118,
                          "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                         );
          }
          pSVar23 = (self_02->heads).contents[uVar25 & 0xffffffff].node;
          uVar20 = (self_02->iterators).capacity;
          if ((self_02->iterators).size != uVar20) goto LAB_0012facc;
          uVar29 = 8;
          if (8 < uVar20 * 2) {
            uVar29 = uVar20 * 2;
          }
          if (uVar29 <= uVar20) goto LAB_0012facc;
          pSVar21 = (self_02->iterators).contents;
          plVar36 = (long *)(ulong)uVar29;
          if (pSVar21 == (StackIterator *)0x0) {
LAB_0012faae:
            uVar20 = 0x20;
            pSVar21 = (StackIterator *)calloc((size_t)plVar36,0x20);
            if (pSVar21 == (StackIterator *)0x0) {
              ts_stack_pop_pending_cold_6();
              if (uVar20 != extraout_EDX_00) {
                if (uVar20 <= extraout_EDX_00) {
                  __assert_fail("v2 < v1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                                ,0x265,
                                "void ts_stack_renumber_version(Stack *, StackVersion, StackVersion)"
                               );
                }
                if (*(uint *)(plVar36 + 1) <= uVar20) {
                  __assert_fail("(uint32_t)v1 < self->heads.size",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                                ,0x266,
                                "void ts_stack_renumber_version(Stack *, StackVersion, StackVersion)"
                               );
                }
                puVar2 = (undefined8 *)(*plVar36 + (ulong)uVar20 * 0x28);
                self_00 = (StackHead *)(*plVar36 + (ulong)extraout_EDX_00 * 0x28);
                if ((self_00->summary != (StackSummary *)0x0) && (puVar2[2] == 0)) {
                  puVar2[2] = self_00->summary;
                  self_00->summary = (StackSummary *)0x0;
                }
                stack_head_delete(self_00,(StackNodeArray *)(plVar36 + 6),(SubtreePool *)plVar36[9])
                ;
                *(undefined8 *)&self_00->status = puVar2[4];
                pSVar23 = (StackNode *)*puVar2;
                SVar28 = *(Subtree *)(puVar2 + 1);
                uVar8 = puVar2[3];
                self_00->summary = (StackSummary *)puVar2[2];
                self_00->node_count_at_last_error = (int)uVar8;
                self_00->lookahead_when_paused = (short)((ulong)uVar8 >> 0x20);
                *(short *)&self_00->field_0x1e = (short)((ulong)uVar8 >> 0x30);
                self_00->node = pSVar23;
                self_00->last_external_token = SVar28;
                if (*(uint *)(plVar36 + 1) <= uVar20) {
                  __assert_fail("index < self->size",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/array.h"
                                ,0x4f,"void array__erase(VoidArray *, size_t, uint32_t)");
                }
                memmove((void *)(*plVar36 + (ulong)uVar20 * 0x28),
                        (void *)(*plVar36 + (ulong)(uVar20 + 1) * 0x28),
                        (ulong)(*(uint *)(plVar36 + 1) + ~uVar20) * 0x28);
                *(int *)(plVar36 + 1) = (int)plVar36[1] + -1;
              }
              return;
            }
          }
          else {
            plVar36 = (long *)((long)plVar36 << 5);
            pSVar21 = (StackIterator *)realloc(pSVar21,(size_t)plVar36);
            if (pSVar21 == (StackIterator *)0x0) {
              ts_stack_pop_pending_cold_1();
              goto LAB_0012faae;
            }
          }
          (self_02->iterators).contents = pSVar21;
          (self_02->iterators).capacity = uVar29;
LAB_0012facc:
          pSVar21 = (self_02->iterators).contents;
          uVar20 = (self_02->iterators).size;
          (self_02->iterators).size = uVar20 + 1;
          pSVar21[uVar20].node = pSVar23;
          pSVar24 = &pSVar21[uVar20].subtrees;
          pSVar24->contents = (Subtree *)0x0;
          pSVar24->size = 0;
          pSVar24->capacity = 0;
          pSVar21[uVar20].subtree_count = 0;
          pSVar21[uVar20].is_pending = true;
          uVar20 = (self_02->iterators).size;
          if (uVar20 != 0) {
            uVar35 = 0;
            do {
              do {
                pSVar21 = (self_02->iterators).contents;
                uVar29 = 0;
                if (pSVar21[uVar35].subtree_count != 0) {
                  uVar29 = (uint)pSVar21[uVar35].is_pending * 2 + 1;
                }
                pSVar23 = pSVar21[uVar35].node;
                bVar37 = true;
                if ((uVar29 & 1) == 0) {
                  bVar37 = pSVar23->link_count == 0;
                }
                if (1 < uVar29) {
                  pSVar24 = &pSVar21[uVar35].subtrees;
                  SStack_188.contents = pSVar24->contents;
                  uVar12 = pSVar21[uVar35].subtrees.size;
                  uVar13 = pSVar21[uVar35].subtrees.capacity;
                  uVar14 = pSVar24->contents;
                  uVar15 = pSVar24->size;
                  self_01.size = uVar15;
                  self_01.contents = (Subtree *)uVar14;
                  SStack_188.size = uVar12;
                  SStack_188.capacity = uVar13;
                  if (!bVar37) {
                    self_01.capacity = uVar13;
                    ts_subtree_array_copy(self_01,&SStack_188);
                  }
                  if (1 < SStack_188.size) {
                    uVar32 = 0;
                    uVar19 = SStack_188.size;
                    do {
                      uVar19 = uVar19 - 1;
                      SVar28 = SStack_188.contents[uVar32];
                      SStack_188.contents[uVar32] = SStack_188.contents[uVar19];
                      SStack_188.contents[uVar19] = SVar28;
                      uVar32 = uVar32 + 1;
                    } while (SStack_188.size >> 1 != uVar32);
                  }
                  ts_stack__add_slice(self_02,uVar18,pSVar23,&SStack_188);
                }
                uVar19 = (uint)uVar35;
                if (bVar37) {
                  if (uVar29 < 2) {
                    ts_subtree_array_delete(self_02->subtree_pool,&pSVar21[uVar35].subtrees);
                  }
                  uVar29 = (self_02->iterators).size;
                  if (uVar29 <= uVar19) {
LAB_0012fedb:
                    __assert_fail("index < self->size",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/array.h"
                                  ,0x4f,"void array__erase(VoidArray *, size_t, uint32_t)");
                  }
                  pSVar21 = (self_02->iterators).contents;
                  memmove(pSVar21 + uVar35,pSVar21 + uVar35 + 1,(ulong)(uVar29 + ~uVar19) << 5);
                  puVar1 = &(self_02->iterators).size;
                  *puVar1 = *puVar1 - 1;
                  uVar20 = uVar20 - 1;
                }
                else {
                  uVar32 = (ulong)pSVar23->link_count;
                  if (pSVar23->link_count != 0) {
                    p_Var27 = &pSVar23->links[1].is_pending;
                    uVar25 = 0;
                    do {
                      uVar25 = uVar25 + 1;
                      if (uVar25 == uVar32) {
                        pSVar34 = pSVar23->links[0].node;
                        SVar28 = pSVar23->links[0].subtree;
                        bStack_1b9 = pSVar23->links[0].is_pending;
                        pSVar21 = (self_02->iterators).contents + uVar35;
LAB_0012fd83:
                        pSVar21->node = pSVar34;
                        if (SVar28.ptr == (SubtreeHeapData *)0x0) {
                          pSVar21->subtree_count = pSVar21->subtree_count + 1;
                        }
                        else {
                          uVar29 = (pSVar21->subtrees).capacity;
                          if ((pSVar21->subtrees).size == uVar29) {
                            uVar33 = uVar29 * 2;
                            if (uVar33 < 9) {
                              uVar33 = 8;
                            }
                            if (uVar29 < uVar33) {
                              pSVar22 = (pSVar21->subtrees).contents;
                              if (pSVar22 == (Subtree *)0x0) {
                                pSVar22 = (Subtree *)calloc((ulong)uVar33,8);
                                if (pSVar22 == (Subtree *)0x0) {
                                  ts_stack_pop_pending_cold_5();
                                  goto LAB_0012ff02;
                                }
                              }
                              else {
                                pSVar22 = (Subtree *)realloc(pSVar22,(ulong)uVar33 << 3);
                                if (pSVar22 == (Subtree *)0x0) {
                                  ts_stack_pop_pending_cold_4();
                                  goto LAB_0012fedb;
                                }
                              }
                              (pSVar21->subtrees).contents = pSVar22;
                              (pSVar21->subtrees).capacity = uVar33;
                            }
                          }
                          uVar29 = (pSVar21->subtrees).size;
                          (pSVar21->subtrees).size = uVar29 + 1;
                          (pSVar21->subtrees).contents[uVar29] = SVar28;
                          ts_subtree_retain(SVar28);
                          if (((ulong)SVar28.ptr & 1) == 0) {
                            uVar29 = *(uint *)&(SVar28.ptr)->field_0x2c >> 2;
                          }
                          else {
                            uVar29 = (uint)((ulong)SVar28.ptr >> 3) & 0x1fffffff;
                          }
                          if (((uVar29 & 1) != 0) ||
                             (pSVar21->subtree_count = pSVar21->subtree_count + 1,
                             (bStack_1b9 & 1) != 0)) goto LAB_0012fe38;
                        }
                        pSVar21->is_pending = false;
                      }
                      else if ((self_02->iterators).size < 0x40) {
                        pSVar34 = ((StackLink *)(p_Var27 + -0x10))->node;
                        SVar28 = *(Subtree *)(p_Var27 + -8);
                        bStack_1b9 = *p_Var27;
                        pSVar21 = (self_02->iterators).contents;
                        SStack_188.contents = (Subtree *)pSVar21[uVar35].node;
                        pSVar22 = pSVar21[uVar35].subtrees.contents;
                        pSVar24 = &pSVar21[uVar35].subtrees;
                        uStack_178._0_4_ = pSVar24->size;
                        uStack_178._4_4_ = pSVar24->capacity;
                        uStack_170 = pSVar24[1].contents;
                        SStack_188.size = (uint32_t)pSVar22;
                        SStack_188.capacity = (uint32_t)((ulong)pSVar22 >> 0x20);
                        uVar29 = (self_02->iterators).capacity;
                        if ((self_02->iterators).size != uVar29) {
LAB_0012fd2a:
                          pSVar21 = (self_02->iterators).contents;
                          uVar29 = (self_02->iterators).size;
                          (self_02->iterators).size = uVar29 + 1;
                          pSVar5 = pSVar21 + uVar29;
                          (pSVar5->subtrees).size = (undefined4)uStack_178;
                          (pSVar5->subtrees).capacity = uStack_178._4_4_;
                          *(undefined8 *)(&(pSVar5->subtrees).size + 2) = uStack_170;
                          pSVar21 = pSVar21 + uVar29;
                          pSVar21->node = (StackNode *)SStack_188.contents;
                          (pSVar21->subtrees).contents =
                               (Subtree *)CONCAT44(SStack_188.capacity,SStack_188.size);
                          uVar3 = (self_02->iterators).size;
                          if (uVar3 == 0) {
                            __assert_fail("(uint32_t)(&self->iterators)->size - 1 < (&self->iterators)->size"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                                          ,0x151,
                                          "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                                         );
                          }
                          uVar29 = uVar3 - 1;
                          pSVar5 = (self_02->iterators).contents;
                          pSVar21 = pSVar5 + uVar29;
                          pSVar24 = &pSVar5[uVar29].subtrees;
                          ts_subtree_array_copy(*pSVar24,pSVar24);
                          goto LAB_0012fd83;
                        }
                        uVar33 = uVar29 * 2;
                        if (uVar33 < 9) {
                          uVar33 = 8;
                        }
                        if (uVar33 <= uVar29) goto LAB_0012fd2a;
                        if (pSVar21 == (StackIterator *)0x0) {
                          pSVar21 = (StackIterator *)calloc((ulong)uVar33,0x20);
                          if (pSVar21 != (StackIterator *)0x0) goto LAB_0012fd1d;
                        }
                        else {
                          pSVar21 = (StackIterator *)realloc(pSVar21,(ulong)uVar33 << 5);
                          if (pSVar21 != (StackIterator *)0x0) {
LAB_0012fd1d:
                            (self_02->iterators).contents = pSVar21;
                            (self_02->iterators).capacity = uVar33;
                            goto LAB_0012fd2a;
                          }
LAB_0012ff02:
                          ts_stack_pop_pending_cold_2();
                        }
                        ts_stack_pop_pending_cold_3();
                        goto LAB_0012ff12;
                      }
LAB_0012fe38:
                      uVar32 = (ulong)pSVar23->link_count;
                      p_Var27 = p_Var27 + 0x18;
                    } while (uVar25 < uVar32);
                  }
                  uVar35 = (ulong)(uVar19 + 1);
                }
              } while ((uint)uVar35 < uVar20);
              uVar20 = (self_02->iterators).size;
              uVar35 = 0;
            } while (uVar20 != 0);
          }
          pSVar6 = (self_02->slices).contents;
          uVar4 = (self_02->slices).size;
          if (uVar4 != 0) {
            ts_stack_renumber_version(self_02,pSVar6->version,uVar18);
            pSVar6->version = uVar18;
          }
          return;
        }
      }
      else {
        pSVar31 = (Stack *)((long)pSVar26 << 5);
        pSStack_138 = (Stack *)0x12f5d9;
        pSVar21 = (StackIterator *)realloc(pSVar21,(size_t)pSVar31);
        if (pSVar21 == (StackIterator *)0x0) {
          pSStack_138 = (Stack *)0x12f5e6;
          ts_stack_pop_count_cold_1();
          goto LAB_0012f5e6;
        }
      }
      (pSStack_120->iterators).contents = pSVar21;
      (pSStack_120->iterators).capacity = (uint)pSVar26;
LAB_0012f60b:
      pSVar21 = (pSStack_120->iterators).contents;
      uVar18 = (pSStack_120->iterators).size;
      (pSStack_120->iterators).size = uVar18 + 1;
      pSVar21[uVar18].node = pSVar23;
      pSVar21[uVar18].subtrees.contents = pSVar22;
      pSVar21[uVar18].subtrees.size = 0;
      pSVar21[uVar18].subtrees.capacity = (uint32_t)uVar35;
      pSVar21[uVar18].subtree_count = 0;
      pSVar21[uVar18].is_pending = true;
      uStack_118 = (pSStack_120->iterators).size;
      uStack_114 = extraout_EDX;
      uVar18 = extraout_EDX;
      pSVar26 = pSStack_120;
      do {
        uVar35 = 0;
        if (uStack_118 == 0) {
          return;
        }
        do {
          pSVar21 = (pSVar26->iterators).contents;
          uVar32 = uVar35 & 0xffffffff;
          lStack_108 = uVar32 * 0x20;
          pSStack_110 = pSVar21[uVar32].node;
          uVar20 = pSVar21[uVar32].subtree_count;
          bVar37 = true;
          uStack_f8 = uVar35;
          if (uVar20 == uVar18) {
            SStack_f0.contents = pSVar21[uVar32].subtrees.contents;
            uVar9 = pSVar21[uVar32].subtrees.size;
            uVar10 = pSVar21[uVar32].subtrees.capacity;
            if (1 < (uint)uVar9) {
              uVar35 = 0;
              uVar29 = uVar9;
              do {
                uVar29 = uVar29 - 1;
                SVar28 = SStack_f0.contents[uVar35];
                SStack_f0.contents[uVar35] = SStack_f0.contents[uVar29];
                SStack_f0.contents[uVar29] = SVar28;
                uVar35 = uVar35 + 1;
              } while ((uint)uVar9 >> 1 != uVar35);
            }
            pSStack_138 = (Stack *)0x12f702;
            SStack_f0.size = uVar9;
            SStack_f0.capacity = uVar10;
            ts_stack__add_slice(pSVar26,uStack_fc,pSStack_110,&SStack_f0);
          }
          else {
            bVar37 = pSStack_110->link_count == 0;
          }
          if (bVar37) {
            if (uVar20 != uVar18) {
              pSStack_138 = (Stack *)0x12f71c;
              ts_subtree_array_delete(pSVar26->subtree_pool,&pSVar21[uVar32].subtrees);
            }
            uVar35 = uStack_f8;
            uVar20 = (pSVar26->iterators).size;
            if (uVar20 <= (uint)uStack_f8) {
              pSStack_138 = (Stack *)0x12f9f6;
              __assert_fail("index < self->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/array.h"
                            ,0x4f,"void array__erase(VoidArray *, size_t, uint32_t)");
            }
            pSVar21 = (pSVar26->iterators).contents;
            pSStack_138 = (Stack *)0x12f756;
            memmove((void *)((long)&pSVar21->node + lStack_108),pSVar21 + uVar32 + 1,
                    (ulong)(uVar20 + ~(uint)uStack_f8) << 5);
            puVar1 = &(pSVar26->iterators).size;
            *puVar1 = *puVar1 - 1;
            uStack_118 = uStack_118 - 1;
          }
          else {
            uVar35 = (ulong)pSStack_110->link_count;
            if (pSStack_110->link_count != 0) {
              p_Var27 = &pSStack_110->links[1].is_pending;
              uVar32 = 0;
              pSVar23 = pSStack_110;
              do {
                uVar32 = uVar32 + 1;
                if (uVar32 == uVar35) {
                  pSVar34 = pSVar23->links[0].node;
                  SVar28 = pSVar23->links[0].subtree;
                  bStack_121 = pSVar23->links[0].is_pending;
                  pSVar21 = (StackIterator *)
                            ((long)&((pSVar26->iterators).contents)->node + lStack_108);
LAB_0012f89e:
                  pSVar21->node = pSVar34;
                  if (SVar28.ptr == (SubtreeHeapData *)0x0) {
                    pSVar21->subtree_count = pSVar21->subtree_count + 1;
                  }
                  else {
                    if (-1 < (int)uStack_114) {
                      uVar18 = (pSVar21->subtrees).capacity;
                      if ((pSVar21->subtrees).size == uVar18) {
                        uVar20 = uVar18 * 2;
                        if (uVar20 < 9) {
                          uVar20 = 8;
                        }
                        if (uVar18 < uVar20) {
                          pSVar22 = (pSVar21->subtrees).contents;
                          if (pSVar22 == (Subtree *)0x0) {
                            pSStack_138 = (Stack *)0x12f902;
                            pSVar22 = (Subtree *)calloc((ulong)uVar20,8);
                            if (pSVar22 == (Subtree *)0x0) goto LAB_0012fa06;
                          }
                          else {
                            pSStack_138 = (Stack *)0x12f8e6;
                            pSVar22 = (Subtree *)realloc(pSVar22,(ulong)uVar20 << 3);
                            if (pSVar22 == (Subtree *)0x0) {
                              pSStack_138 = (Stack *)0x12f9fe;
                              ts_stack_pop_count_cold_4();
                              goto LAB_0012f9fe;
                            }
                          }
                          (pSVar21->subtrees).contents = pSVar22;
                          (pSVar21->subtrees).capacity = uVar20;
                        }
                      }
                      uVar18 = (pSVar21->subtrees).size;
                      (pSVar21->subtrees).size = uVar18 + 1;
                      (pSVar21->subtrees).contents[uVar18] = SVar28;
                      pSStack_138 = (Stack *)0x12f92c;
                      ts_subtree_retain(SVar28);
                      pSVar23 = pSStack_110;
                      pSVar26 = pSStack_120;
                    }
                    if (((ulong)SVar28.ptr & 1) == 0) {
                      uVar18 = *(uint *)&(SVar28.ptr)->field_0x2c >> 2;
                    }
                    else {
                      uVar18 = (uint)((ulong)SVar28.ptr >> 3) & 0x1fffffff;
                    }
                    if (((uVar18 & 1) != 0) ||
                       (pSVar21->subtree_count = pSVar21->subtree_count + 1, (bStack_121 & 1) != 0))
                    goto LAB_0012f961;
                  }
                  pSVar21->is_pending = false;
                }
                else if ((pSVar26->iterators).size < 0x40) {
                  pSVar34 = ((StackLink *)(p_Var27 + -0x10))->node;
                  SVar28 = *(Subtree *)(p_Var27 + -8);
                  bStack_121 = *p_Var27;
                  pSVar21 = (pSVar26->iterators).contents;
                  plVar36 = (long *)((long)&pSVar21->node + lStack_108);
                  SStack_f0.contents = (Subtree *)*plVar36;
                  lVar11 = plVar36[1];
                  puVar2 = (undefined8 *)((long)&(pSVar21->subtrees).size + lStack_108);
                  uStack_e0 = *puVar2;
                  uStack_d8 = puVar2[1];
                  SStack_f0.size = (uint32_t)lVar11;
                  SStack_f0.capacity = (uint32_t)((ulong)lVar11 >> 0x20);
                  uVar18 = (pSVar26->iterators).capacity;
                  if ((pSVar26->iterators).size != uVar18) {
LAB_0012f840:
                    pSVar26 = pSStack_120;
                    pSVar21 = (pSStack_120->iterators).contents;
                    uVar18 = (pSStack_120->iterators).size;
                    (pSStack_120->iterators).size = uVar18 + 1;
                    pSVar5 = pSVar21 + uVar18;
                    (pSVar5->subtrees).size = (undefined4)uStack_e0;
                    (pSVar5->subtrees).capacity = uStack_e0._4_4_;
                    *(undefined8 *)(&(pSVar5->subtrees).size + 2) = uStack_d8;
                    pSVar21 = pSVar21 + uVar18;
                    pSVar21->node = (StackNode *)SStack_f0.contents;
                    (pSVar21->subtrees).contents =
                         (Subtree *)CONCAT44(SStack_f0.capacity,SStack_f0.size);
                    uVar3 = (pSStack_120->iterators).size;
                    if (uVar3 == 0) {
                      pSStack_138 = (Stack *)0x12f9d7;
                      __assert_fail("(uint32_t)(&self->iterators)->size - 1 < (&self->iterators)->size"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                                    ,0x151,
                                    "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                                   );
                    }
                    uVar18 = uVar3 - 1;
                    pSVar5 = (pSStack_120->iterators).contents;
                    pSVar21 = pSVar5 + uVar18;
                    pSVar24 = &pSVar5[uVar18].subtrees;
                    pSStack_138 = (Stack *)0x12f899;
                    ts_subtree_array_copy(*pSVar24,pSVar24);
                    pSVar23 = pSStack_110;
                    goto LAB_0012f89e;
                  }
                  uVar20 = uVar18 * 2;
                  if (uVar20 < 9) {
                    uVar20 = 8;
                  }
                  if (uVar20 <= uVar18) goto LAB_0012f840;
                  if (pSVar21 == (StackIterator *)0x0) {
                    pSStack_138 = (Stack *)0x12f82a;
                    pSVar21 = (StackIterator *)calloc((ulong)uVar20,0x20);
                    if (pSVar21 != (StackIterator *)0x0) goto LAB_0012f833;
                  }
                  else {
                    pSStack_138 = (Stack *)0x12f813;
                    pSVar21 = (StackIterator *)realloc(pSVar21,(ulong)uVar20 << 5);
                    if (pSVar21 != (StackIterator *)0x0) {
LAB_0012f833:
                      (pSStack_120->iterators).contents = pSVar21;
                      (pSStack_120->iterators).capacity = uVar20;
                      goto LAB_0012f840;
                    }
LAB_0012f9fe:
                    pSStack_138 = (Stack *)0x12fa06;
                    ts_stack_pop_count_cold_2();
LAB_0012fa06:
                    pSStack_138 = (Stack *)0x12fa0e;
                    ts_stack_pop_count_cold_5();
                  }
                  pSStack_138 = (Stack *)0x12fa16;
                  ts_stack_pop_count_cold_3();
                  goto LAB_0012fa16;
                }
LAB_0012f961:
                uVar35 = (ulong)pSVar23->link_count;
                p_Var27 = p_Var27 + 0x18;
              } while (uVar32 < uVar35);
            }
            uVar35 = (ulong)((int)uStack_f8 + 1);
            uVar18 = uStack_114;
          }
        } while ((uint)uVar35 < uStack_118);
        uStack_118 = (pSVar26->iterators).size;
      } while( true );
    }
  }
  else {
    pSVar26 = (Stack *)((long)pSVar26 << 5);
    pSVar21 = (StackIterator *)realloc(pSVar21,(size_t)pSVar26);
    if (pSVar21 == (StackIterator *)0x0) {
      ts_stack_iterate_cold_1();
      goto LAB_0012f202;
    }
  }
  (self->iterators).contents = pSVar21;
  (self->iterators).capacity = uVar20;
LAB_0012f225:
  pSVar21 = (self->iterators).contents;
  uVar18 = (self->iterators).size;
  (self->iterators).size = uVar18 + 1;
  pSVar21[uVar18].node = pSVar23;
  pSVar24 = &pSVar21[uVar18].subtrees;
  pSVar24->contents = (Subtree *)0x0;
  pSVar24->size = 0;
  pSVar24->capacity = 0;
  pSVar21[uVar18].subtree_count = 0;
  pSVar21[uVar18].is_pending = true;
  uVar18 = (self->iterators).size;
  if (uVar18 != 0) {
    uVar35 = 0;
    do {
      do {
        pSVar21 = (self->iterators).contents;
        pSVar23 = pSVar21[uVar35].node;
        (*callback)(payload,pSVar23->state,pSVar21[uVar35].subtree_count);
        uVar20 = (uint)uVar35;
        if (pSVar23->link_count == 0) {
          ts_subtree_array_delete(self->subtree_pool,&pSVar21[uVar35].subtrees);
          uVar29 = (self->iterators).size;
          if (uVar29 <= uVar20) {
LAB_0012f4ed:
            __assert_fail("index < self->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/array.h"
                          ,0x4f,"void array__erase(VoidArray *, size_t, uint32_t)");
          }
          pSVar21 = (self->iterators).contents;
          memmove(pSVar21 + uVar35,pSVar21 + uVar35 + 1,(ulong)(uVar29 + ~uVar20) << 5);
          puVar1 = &(self->iterators).size;
          *puVar1 = *puVar1 - 1;
          uVar18 = uVar18 - 1;
        }
        else {
          uVar32 = (ulong)pSVar23->link_count;
          if (pSVar23->link_count != 0) {
            p_Var27 = &pSVar23->links[1].is_pending;
            uVar25 = 0;
            do {
              uVar25 = uVar25 + 1;
              if (uVar25 == uVar32) {
                pSVar34 = pSVar23->links[0].node;
                pSVar30 = pSVar23->links[0].subtree.ptr;
                bVar17 = pSVar23->links[0].is_pending;
                pSVar21 = (self->iterators).contents + uVar35;
LAB_0012f3e6:
                pSVar21->node = pSVar34;
                if (pSVar30 == (SubtreeHeapData *)0x0) {
                  pSVar21->subtree_count = pSVar21->subtree_count + 1;
                }
                else {
                  if (((ulong)pSVar30 & 1) == 0) {
                    uVar29 = *(uint *)&pSVar30->field_0x2c >> 2;
                  }
                  else {
                    uVar29 = (uint)((ulong)pSVar30 >> 3) & 0x1fffffff;
                  }
                  if (((uVar29 & 1) != 0) ||
                     (pSVar21->subtree_count = pSVar21->subtree_count + 1, (bVar17 & 1) != 0))
                  goto LAB_0012f41f;
                }
                pSVar21->is_pending = false;
              }
              else if ((self->iterators).size < 0x40) {
                pSVar34 = ((StackLink *)(p_Var27 + -0x10))->node;
                pSVar30 = ((Subtree *)(p_Var27 + -8))->ptr;
                bVar17 = *p_Var27;
                pSVar21 = (self->iterators).contents;
                pSVar7 = pSVar21[uVar35].node;
                pSVar22 = pSVar21[uVar35].subtrees.contents;
                pSVar24 = &pSVar21[uVar35].subtrees;
                uVar3 = pSVar24->size;
                uVar16 = pSVar24->capacity;
                uVar8 = pSVar24[1].contents;
                uVar29 = (self->iterators).capacity;
                if ((self->iterators).size == uVar29) {
                  uVar19 = uVar29 * 2;
                  if (uVar19 < 9) {
                    uVar19 = 8;
                  }
                  if (uVar29 < uVar19) {
                    if (pSVar21 == (StackIterator *)0x0) {
                      pSVar21 = (StackIterator *)calloc((ulong)uVar19,0x20);
                      if (pSVar21 == (StackIterator *)0x0) {
                        ts_stack_iterate_cold_3();
                        goto LAB_0012f516;
                      }
                    }
                    else {
                      pSVar21 = (StackIterator *)realloc(pSVar21,(ulong)uVar19 << 5);
                      if (pSVar21 == (StackIterator *)0x0) {
                        ts_stack_iterate_cold_2();
                        goto LAB_0012f4ed;
                      }
                    }
                    (self->iterators).contents = pSVar21;
                    (self->iterators).capacity = uVar19;
                  }
                }
                pSVar21 = (self->iterators).contents;
                uVar29 = (self->iterators).size;
                (self->iterators).size = uVar29 + 1;
                pSVar5 = pSVar21 + uVar29;
                (pSVar5->subtrees).size = uVar3;
                (pSVar5->subtrees).capacity = uVar16;
                *(undefined8 *)(&(pSVar5->subtrees).size + 2) = uVar8;
                pSVar21 = pSVar21 + uVar29;
                pSVar21->node = pSVar7;
                (pSVar21->subtrees).contents = pSVar22;
                uVar3 = (self->iterators).size;
                if (uVar3 == 0) {
                  __assert_fail("(uint32_t)(&self->iterators)->size - 1 < (&self->iterators)->size",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                                ,0x151,
                                "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                               );
                }
                uVar29 = uVar3 - 1;
                pSVar5 = (self->iterators).contents;
                pSVar21 = pSVar5 + uVar29;
                pSVar24 = &pSVar5[uVar29].subtrees;
                ts_subtree_array_copy(*pSVar24,pSVar24);
                goto LAB_0012f3e6;
              }
LAB_0012f41f:
              uVar32 = (ulong)pSVar23->link_count;
              p_Var27 = p_Var27 + 0x18;
            } while (uVar25 < uVar32);
          }
          uVar35 = (ulong)(uVar20 + 1);
        }
      } while ((uint)uVar35 < uVar18);
      uVar18 = (self->iterators).size;
      uVar35 = 0;
    } while (uVar18 != 0);
  }
  return;
}

Assistant:

void ts_stack_iterate(Stack *self, StackVersion version,
                      StackIterateCallback callback, void *payload) {
  StackIterateSession session = {payload, callback};
  stack__iter(self, version, iterate_callback, &session, -1);
}